

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dist.c
# Opt level: O0

REF_STATUS
ref_dist_collisions(REF_GRID ref_grid,REF_BOOL report,char *filename,REF_INT *n_collisions)

{
  int iVar1;
  uint uVar2;
  REF_STATUS RVar3;
  REF_BOOL RVar4;
  FILE *__stream;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_INT node;
  REF_INT faceid;
  FILE *file;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_LIST collision_faceid;
  REF_LIST collision_node;
  REF_LIST ref_list;
  REF_SEARCH ref_search;
  double dStack_f8;
  REF_BOOL pierce;
  REF_DBL scale;
  REF_DBL radius;
  REF_DBL center [3];
  uint local_c8 [2];
  REF_INT nodes [27];
  int local_54;
  int local_50;
  REF_INT cell;
  REF_INT edge;
  REF_INT item;
  REF_EDGE ref_edge;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_INT *n_collisions_local;
  char *filename_local;
  REF_GRID pRStack_18;
  REF_BOOL report_local;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  ref_edge = (REF_EDGE)ref_grid->cell[3];
  dStack_f8 = 1.01;
  *n_collisions = 0;
  ref_node = (REF_NODE)n_collisions;
  n_collisions_local = (REF_INT *)filename;
  filename_local._4_4_ = report;
  pRStack_18 = ref_grid;
  uVar2 = ref_edge_create((REF_EDGE *)&edge,ref_grid);
  if (uVar2 == 0) {
    uVar2 = ref_search_create((REF_SEARCH *)&ref_list,*(REF_INT *)&ref_edge[1].e2n);
    if (uVar2 == 0) {
      for (local_54 = 0; local_54 < *(int *)((long)&ref_edge[1].e2n + 4); local_54 = local_54 + 1) {
        RVar3 = ref_cell_nodes((REF_CELL)ref_edge,local_54,(REF_INT *)local_c8);
        if (RVar3 == 0) {
          uVar2 = ref_dist_bounding_sphere3((REF_NODE)ref_cell,(REF_INT *)local_c8,&radius,&scale);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c",
                   0x83,"ref_dist_collisions",(ulong)uVar2,"b");
            return uVar2;
          }
          uVar2 = ref_search_insert((REF_SEARCH)ref_list,local_54,&radius,dStack_f8 * scale);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c",
                   0x84,"ref_dist_collisions",(ulong)uVar2,"insert");
            return uVar2;
          }
        }
      }
      uVar2 = ref_list_create(&collision_faceid);
      if (uVar2 == 0) {
        uVar2 = ref_list_create((REF_LIST *)&ref_private_macro_code_rss_1);
        if (uVar2 == 0) {
          uVar2 = ref_list_create(&collision_node);
          if (uVar2 == 0) {
            for (local_50 = 0; local_50 < _edge->n; local_50 = local_50 + 1) {
              uVar2 = ref_dist_bounding_sphere2
                                ((REF_NODE)ref_cell,_edge->e2n[local_50 << 1],
                                 _edge->e2n[local_50 * 2 + 1],&radius,&scale);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c"
                       ,0x8f,"ref_dist_collisions",(ulong)uVar2,"b");
                return uVar2;
              }
              uVar2 = ref_search_touching((REF_SEARCH)ref_list,collision_node,&radius,
                                          dStack_f8 * scale);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c"
                       ,0x91,"ref_dist_collisions",(ulong)uVar2,"touch");
                return uVar2;
              }
              for (cell = 0; cell < collision_node->n; cell = cell + 1) {
                uVar2 = ref_cell_nodes((REF_CELL)ref_edge,collision_node->value[cell],
                                       (REF_INT *)local_c8);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c"
                         ,0x94,"ref_dist_collisions",(ulong)uVar2,"cell nodes");
                  return uVar2;
                }
                RVar4 = ref_dist_exclude(_edge->e2n[local_50 << 1],_edge->e2n[local_50 * 2 + 1],
                                         (REF_INT *)local_c8);
                if (RVar4 == 0) {
                  uVar2 = ref_dist_pierce((REF_NODE)ref_cell,_edge->e2n[local_50 << 1],
                                          _edge->e2n[local_50 * 2 + 1],(REF_INT *)local_c8,
                                          (REF_BOOL *)((long)&ref_search + 4));
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c"
                           ,0x9a,"ref_dist_collisions",(ulong)uVar2,"hits?");
                    return uVar2;
                  }
                  if (ref_search._4_4_ != 0) {
                    uVar2 = ref_list_push(collision_faceid,local_c8[0]);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c"
                             ,0x9c,"ref_dist_collisions",(ulong)uVar2,"push node");
                      return uVar2;
                    }
                    uVar2 = ref_list_push(_ref_private_macro_code_rss_1,
                                          local_c8[*(int *)((long)&ref_edge->e2n + 4)]);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c"
                             ,0x9e,"ref_dist_collisions",(ulong)uVar2,"push faceid");
                      return uVar2;
                    }
                    ref_node->n = ref_node->n + 1;
                    if (filename_local._4_4_ != 0) {
                      printf("%f %f %f # self intersection of face %d\n",
                             *(undefined8 *)(ref_cell->c2n + (long)(int)(local_c8[0] * 0xf) * 2),
                             *(undefined8 *)(ref_cell->c2n + (long)(int)(local_c8[0] * 0xf + 1) * 2)
                             ,*(undefined8 *)
                               (ref_cell->c2n + (long)(int)(local_c8[0] * 0xf + 2) * 2),
                             (ulong)local_c8[*(int *)((long)&ref_edge->e2n + 4)]);
                    }
                  }
                }
              }
              uVar2 = ref_list_erase(collision_node);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c"
                       ,0xa9,"ref_dist_collisions",(ulong)uVar2,"erase");
                return uVar2;
              }
            }
            if ((n_collisions_local != (REF_INT *)0x0) && (0 < ref_node->n)) {
              __stream = fopen((char *)n_collisions_local,"w");
              if (__stream == (FILE *)0x0) {
                printf("unable to open %s\n",n_collisions_local);
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c"
                       ,0xb1,"ref_dist_collisions","unable to open file");
                return 2;
              }
              fprintf(__stream,"title=\"tecplot refine surface self intersections\"\n");
              fprintf(__stream,"variables = \"x\" \"y\" \"z\"\n");
              if ((long)ref_node->n != (long)collision_faceid->n) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c"
                       ,0xb4,"ref_dist_collisions","node miscount",(long)ref_node->n,
                       (long)collision_faceid->n);
                return 1;
              }
              if ((long)ref_node->n != (long)_ref_private_macro_code_rss_1->n) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c"
                       ,0xb5,"ref_dist_collisions","faceid miscount",(long)ref_node->n,
                       (long)_ref_private_macro_code_rss_1->n);
                return 1;
              }
              fprintf(__stream,"zone t=\"intersect\", i=%d, datapacking=%s\n",
                      (ulong)(uint)ref_node->n,"point");
              for (cell = 0; cell < collision_faceid->n; cell = cell + 1) {
                iVar1 = collision_faceid->value[cell];
                fprintf(__stream,"# intersection %d face id\n%f %f %f\n",
                        *(undefined8 *)(ref_cell->c2n + (long)(iVar1 * 0xf) * 2),
                        *(undefined8 *)(ref_cell->c2n + (long)(iVar1 * 0xf + 1) * 2),
                        *(undefined8 *)(ref_cell->c2n + (long)(iVar1 * 0xf + 2) * 2),
                        (ulong)(uint)_ref_private_macro_code_rss_1->value[cell]);
              }
              fclose(__stream);
            }
            uVar2 = ref_list_free(collision_node);
            if (uVar2 == 0) {
              uVar2 = ref_list_free(_ref_private_macro_code_rss_1);
              if (uVar2 == 0) {
                uVar2 = ref_list_free(collision_faceid);
                if (uVar2 == 0) {
                  uVar2 = ref_search_free((REF_SEARCH)ref_list);
                  if (uVar2 == 0) {
                    ref_grid_local._4_4_ = ref_edge_free(_edge);
                    if (ref_grid_local._4_4_ == 0) {
                      ref_grid_local._4_4_ = 0;
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c"
                             ,199,"ref_dist_collisions",(ulong)ref_grid_local._4_4_,"free");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c"
                           ,0xc6,"ref_dist_collisions",(ulong)uVar2,"free");
                    ref_grid_local._4_4_ = uVar2;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c"
                         ,0xc5,"ref_dist_collisions",(ulong)uVar2,"free");
                  ref_grid_local._4_4_ = uVar2;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c"
                       ,0xc4,"ref_dist_collisions",(ulong)uVar2,"free");
                ref_grid_local._4_4_ = uVar2;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c"
                     ,0xc3,"ref_dist_collisions",(ulong)uVar2,"free");
              ref_grid_local._4_4_ = uVar2;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c",
                   0x89,"ref_dist_collisions",(ulong)uVar2,"create list");
            ref_grid_local._4_4_ = uVar2;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c",
                 0x88,"ref_dist_collisions",(ulong)uVar2,"create faceid list");
          ref_grid_local._4_4_ = uVar2;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c",0x87
               ,"ref_dist_collisions",(ulong)uVar2,"create node list");
        ref_grid_local._4_4_ = uVar2;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c",0x81,
             "ref_dist_collisions",(ulong)uVar2,"create search");
      ref_grid_local._4_4_ = uVar2;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c",0x80,
           "ref_dist_collisions",(ulong)uVar2,"create edge");
    ref_grid_local._4_4_ = uVar2;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_dist_collisions(REF_GRID ref_grid, REF_BOOL report,
                                       const char *filename,
                                       REF_INT *n_collisions) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_EDGE ref_edge;
  REF_INT item;
  REF_INT edge;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL center[3], radius, scale = 1.01;
  REF_BOOL pierce;
  REF_SEARCH ref_search;
  REF_LIST ref_list, collision_node, collision_faceid;

  *n_collisions = 0;

  RSS(ref_edge_create(&ref_edge, ref_grid), "create edge");
  RSS(ref_search_create(&ref_search, ref_cell_n(ref_cell)), "create search");
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_dist_bounding_sphere3(ref_node, nodes, center, &radius), "b");
    RSS(ref_search_insert(ref_search, cell, center, scale * radius), "insert");
  }

  RSS(ref_list_create(&collision_node), "create node list");
  RSS(ref_list_create(&collision_faceid), "create faceid list");
  RSS(ref_list_create(&ref_list), "create list");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_dist_bounding_sphere2(ref_node, ref_edge_e2n(ref_edge, 0, edge),
                                  ref_edge_e2n(ref_edge, 1, edge), center,
                                  &radius),
        "b");
    RSS(ref_search_touching(ref_search, ref_list, center, scale * radius),
        "touch");
    each_ref_list_item(ref_list, item) {
      cell = ref_list_value(ref_list, item);
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
      if (ref_dist_exclude(ref_edge_e2n(ref_edge, 0, edge),
                           ref_edge_e2n(ref_edge, 1, edge), nodes))
        continue;
      RSS(ref_dist_pierce(ref_node, ref_edge_e2n(ref_edge, 0, edge),
                          ref_edge_e2n(ref_edge, 1, edge), nodes, &pierce),
          "hits?");
      if (pierce) {
        RSS(ref_list_push(collision_node, nodes[0]), "push node");
        RSS(ref_list_push(collision_faceid, nodes[ref_cell_id_index(ref_cell)]),
            "push faceid");
        (*n_collisions) += 1;
        if (report) {
          printf("%f %f %f # self intersection of face %d\n",
                 ref_node_xyz(ref_node, 0, nodes[0]),
                 ref_node_xyz(ref_node, 1, nodes[0]),
                 ref_node_xyz(ref_node, 2, nodes[0]),
                 nodes[ref_cell_id_index(ref_cell)]);
        }
      }
    }
    RSS(ref_list_erase(ref_list), "erase");
  }

  if (NULL != filename && (*n_collisions) > 0) {
    FILE *file;
    REF_INT faceid, node;
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    fprintf(file, "title=\"tecplot refine surface self intersections\"\n");
    fprintf(file, "variables = \"x\" \"y\" \"z\"\n");
    REIS(*n_collisions, ref_list_n(collision_node), "node miscount");
    REIS(*n_collisions, ref_list_n(collision_faceid), "faceid miscount");
    fprintf(file, "zone t=\"intersect\", i=%d, datapacking=%s\n", *n_collisions,
            "point");
    each_ref_list_item(collision_node, item) {
      node = ref_list_value(collision_node, item);
      faceid = ref_list_value(collision_faceid, item);
      fprintf(file, "# intersection %d face id\n%f %f %f\n", faceid,
              ref_node_xyz(ref_node, 0, node), ref_node_xyz(ref_node, 1, node),
              ref_node_xyz(ref_node, 2, node));
    }

    fclose(file);
  }

  RSS(ref_list_free(ref_list), "free");
  RSS(ref_list_free(collision_faceid), "free");
  RSS(ref_list_free(collision_node), "free");
  RSS(ref_search_free(ref_search), "free");
  RSS(ref_edge_free(ref_edge), "free");

  return REF_SUCCESS;
}